

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall
CLOptions::PrintDescription(CLOptions *this,string *param_description,int left_padding)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  pointer pbVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  desc_words;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CLOptionsHelper::split(param_description,' ',&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar3 = 0;
    pbVar4 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (lVar3 == 0) {
        iVar2 = left_padding;
        if (0 < left_padding) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
        }
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                            pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
LAB_0010a236:
        lVar3 = pbVar4->_M_string_length + (long)left_padding + 1;
      }
      else {
        if (0x50 < pbVar4->_M_string_length + lVar3) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
          iVar2 = left_padding;
          if (0 < left_padding) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                              pbVar4->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          goto LAB_0010a236;
        }
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(pbVar4->_M_dataplus)._M_p,
                            pbVar4->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        lVar3 = lVar3 + pbVar4->_M_string_length + 1;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void CLOptions::PrintDescription(const std::string& param_description, int left_padding)
{
    // Split the description into individual words
    std::vector<std::string> desc_words = CLOptionsHelper::split(param_description, ' ') ;
    std::vector<std::string>::iterator word ;
    
    size_t current_length(0) ;
    
    for (word=desc_words.begin(); word!=desc_words.end(); ++word) {
        // If there are no words on this line, print the next word
        if (current_length == 0) {
            for (int s=0; s<left_padding; s++) std::cout << " " ;
            std::cout << (*word) << " " ;
            current_length = left_padding + word->length() + 1 ;
        }
        // Else, if the next word would send us over the limit of the
        // line, print a new line and then print the word
        else if (current_length+word->length() > CLOPT_MAX_WIDTH) {
            std::cout << std::endl ;
            for (int s=0; s<left_padding; s++) std::cout << " " ;
            std::cout << (*word) << " " ;
            current_length = left_padding + word->length() + 1 ;
        }
        // Else, just print the word
        else {
            std::cout << (*word) << " " ;
            current_length += word->length() + 1 ;
        }
    }
    std::cout << std::endl;
}